

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::unpack_iter_item
               (CVmPackPos *p,CVmObjList *retlst,int *retcnt,CVmPackGroup *group,int *prefix_count)

{
  long *plVar1;
  bool bVar2;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long in_RCX;
  int *in_R8;
  int i_1;
  int i;
  long src_size_1;
  long src_size;
  CVmPackPos p_2;
  CVmPackPos p_1;
  int is_string_type;
  CVmDataSource *src;
  CVmPackType t;
  int len;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  CVmPackType *in_stack_fffffffffffffeb8;
  CVmPackGroup *in_stack_fffffffffffffec0;
  CVmPackType *in_stack_fffffffffffffec8;
  CVmObjList *in_stack_fffffffffffffed0;
  long *plVar8;
  int local_d8;
  int local_d4;
  long local_a0;
  undefined4 local_80;
  int local_5c;
  int local_50;
  int local_4c;
  int local_40;
  int local_2c;
  
  CVmPackType::CVmPackType
            ((CVmPackType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  parse_type((CVmPackPos *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (CVmPackGroup *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  plVar1 = *(long **)(in_RCX + 0x30);
  bVar2 = false;
  iVar4 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  switch(local_80) {
  case 0x22:
    local_2c = 0;
    CVmPackPos::CVmPackPos
              ((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (CVmPackPos *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    while (local_a0 != 0) {
      wVar3 = CVmPackPos::getch_raw
                        ((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                        );
      if (wVar3 == L'\"') {
        CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
        ;
      }
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      local_2c = local_2c + 1;
    }
    iVar4 = CVmPackType::get_count
                      ((CVmPackType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
    ;
    (**(code **)(*plVar1 + 0x40))(plVar1,(long)(local_2c * iVar4),1);
    break;
  case 0x40:
    if (local_40 == 0) {
      plVar8 = plVar1;
      if (local_4c == 0) {
        lVar6 = *(long *)(in_RCX + 0x38);
      }
      else {
        lVar6 = CVmPackGroup::root_stream_ofs
                          ((CVmPackGroup *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
      iVar4 = CVmPackType::get_count
                        ((CVmPackType *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      lVar6 = lVar6 + iVar4;
      lVar7 = (**(code **)(*plVar1 + 0x38))();
      (**(code **)(*plVar8 + 0x40))(plVar8,lVar6 - lVar7,1);
    }
    else {
      unpack_into_list(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_code,
                       (CVmDataSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (CVmPackGroup *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                      );
    }
    break;
  case 0x41:
  case 0x48:
  case 0x55:
  case 0x57:
  case 0x61:
  case 0x62:
  case 0x68:
  case 0x75:
  case 0x77:
    bVar2 = true;
  default:
    if (in_R8 != (int *)0x0) {
      local_5c = *in_R8;
    }
    if (bVar2) {
      unpack_into_list(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_code,
                       (CVmDataSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (CVmPackGroup *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                      );
    }
    else if (local_5c == -2) {
      lVar6 = (**(code **)(*plVar1 + 0x30))();
      while (lVar7 = (**(code **)(*plVar1 + 0x38))(), lVar7 < lVar6) {
        unpack_into_list(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_code,
                         (CVmDataSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (CVmPackGroup *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      }
    }
    else if (local_50 == 0) {
      local_d8 = 0;
      while (iVar4 = local_d8,
            iVar5 = CVmPackType::get_count
                              ((CVmPackType *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
            iVar4 < iVar5) {
        unpack_into_list(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_code,
                         (CVmDataSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (CVmPackGroup *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        local_d8 = local_d8 + 1;
      }
    }
    else {
      lVar6 = (**(code **)(*plVar1 + 0x30))();
      local_d4 = 0;
      while( true ) {
        iVar4 = local_d4;
        iVar5 = CVmPackType::get_count((CVmPackType *)CONCAT44(in_stack_fffffffffffffeb4,local_d4));
        in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb4 & 0xffffff;
        if (iVar4 < iVar5) {
          lVar7 = (**(code **)(*plVar1 + 0x38))();
          in_stack_fffffffffffffeb4 = CONCAT13(lVar7 < lVar6,(int3)in_stack_fffffffffffffeb4);
        }
        if ((char)(in_stack_fffffffffffffeb4 >> 0x18) == '\0') break;
        unpack_into_list(in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->type_code,
                         (CVmDataSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (CVmPackGroup *)CONCAT44(in_stack_fffffffffffffeb4,iVar4));
        local_d4 = local_d4 + 1;
      }
    }
    break;
  case 0x58:
    if (local_4c == 0) {
      iVar4 = CVmPackType::get_count
                        ((CVmPackType *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      (**(code **)(*plVar1 + 0x40))(plVar1,(long)-iVar4,1);
    }
    else {
      iVar4 = alignment_padding(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,iVar4);
      (**(code **)(*plVar1 + 0x40))(plVar1,(long)iVar4,1);
    }
    break;
  case 0x78:
    if (local_4c == 0) {
      iVar4 = CVmPackType::get_count
                        ((CVmPackType *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      (**(code **)(*plVar1 + 0x40))(plVar1,(long)iVar4,1);
    }
    else {
      iVar4 = alignment_padding(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,iVar4);
      (**(code **)(*plVar1 + 0x40))(plVar1,(long)iVar4,1);
    }
    break;
  case 0x7b:
    local_2c = 0;
    CVmPackPos::CVmPackPos
              ((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (CVmPackPos *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    while (iVar4 = CVmPackPos::more((CVmPackPos *)
                                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
          iVar4 != 0) {
      local_2c = local_2c + 1;
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      CVmPackPos::inc((CVmPackPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    iVar4 = CVmPackType::get_count
                      ((CVmPackType *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
    ;
    (**(code **)(*plVar1 + 0x40))(plVar1,(long)(local_2c * iVar4),1);
  }
  return;
}

Assistant:

void CVmPack::unpack_iter_item(VMG_ CVmPackPos *p,
                               CVmObjList *retlst, int &retcnt,
                               CVmPackGroup *group, const int *prefix_count)
{
    int len;
    
    /* parse the template item */
    CVmPackType t;
    parse_type(p, &t, group);

    /* get the data source */
    CVmDataSource *src = group->ds;

    /* check for non-value types and string types */
    int is_string_type = FALSE;
    switch (t.type_code)
    {
    case 'x':
        /* Nul bytes: on input, just skip bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, 1), OSFSK_CUR);
        else
            src->seek(t.get_count(), OSFSK_CUR);
        return;

    case 'X':
        /* back up by 'count' bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, -1), OSFSK_CUR);
        else
            src->seek(-t.get_count(), OSFSK_CUR);
        return;

    case '"':
        /* count the characters in the string */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.len != 0 ; p.inc(), ++len)
        {
            /* if this is a quote, it must be stuttered, so skip it */
            if (p.getch_raw() == '"')
                p.inc();
        }

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '{':
        /* count the hex digit pairs */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.more() ; ++len, p.inc(), p.inc()) ;

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '@':
        /* seek to position or retrieve current position */
        if (t.qu)
        {
            /* @? retrieves the current position as an output value */
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
        }
        else
        {
            /* 
             *   Absolute positioning: seek to the starting position plus the
             *   specified offset.  The starting position is the current
             *   group's starting position, or the whole string's start if
             *   the !  qualifier is present.  
             */
            src->seek((t.bang ? group->root_stream_ofs() : group->stream_ofs)
                      + t.get_count() - src->get_pos(),
                      OSFSK_CUR);
        }
        return;

    case 'a':
    case 'A':
    case 'b':
    case 'u':
    case 'U':
    case 'w':
    case 'W':
    case 'h':
    case 'H':
        /* make a note that this is a string type */
        is_string_type = TRUE;
        break;
    }

    /*
     *   We have a regular unpacking type (not one of the special positioning
     *   codes).  If there's a prefix count, it overrides any count specified
     *   in the type.  
     */
    if (prefix_count != 0)
        t.count = *prefix_count;

    /* 
     *   If it's a string type, the repeat count specifies the length of the
     *   string in the file (in bytes, characters, nibbles, or other units
     *   that vary by template type).  Otherwise, the repeat count is the
     *   number of copies of the item to unpack.  
     */
    if (is_string_type)
    {
        /* 
         *   It's a string type.  The count doesn't specify the number of
         *   strings to write, but rather specifies the number of bytes to
         *   read into one string.  
         */
        unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.count == ITER_STAR)
    {
        /* unpack this item repeatedly until we run out of source */
        long src_size = src->get_size();
        while (src->get_pos() < src_size)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.up_to_count)
    {
        /* 
         *   unpack this item the number of times given by the repeat count,
         *   but stop if we reach EOF first
         */
        long src_size = src->get_size();
        for (int i = 0 ; i < t.get_count() && src->get_pos() < src_size ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else
    {
        /* unpack this item the number of times given by the repeat count */
        for (int i = 0 ; i < t.get_count() ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
}